

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFStream.cpp
# Opt level: O3

void __thiscall
adios2::transport::FileFStream::Open
          (FileFStream *this,string *name,Mode openMode,bool async,bool directio)

{
  string *__rhs;
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _Result_base *this_00;
  long *plVar4;
  size_type *psVar5;
  _Ios_Openmode _Var6;
  element_type *peVar7;
  element_type *peVar8;
  _State_baseV2 *__tmp;
  string *process;
  shared_ptr<std::__future_base::_State_baseV2> __state;
  __basic_future<void> local_178;
  element_type *local_168;
  long *local_160;
  undefined1 local_158 [40];
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __rhs = &(this->super_Transport).m_Name;
  std::__cxx11::string::_M_assign((string *)__rhs);
  (*(this->super_Transport)._vptr_Transport[0x13])(this);
  (this->super_Transport).m_OpenMode = openMode;
  _Var6 = (_Ios_Openmode)name;
  if (openMode == Append) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"open","");
    Transport::ProfilerStart(&this->super_Transport,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    std::fstream::open((string *)&this->m_FileStream,_Var6);
    std::ostream::seekp((long)&this->field_0x100,_S_beg);
    peVar8 = (element_type *)&local_b0.field_2;
    process = &local_b0;
    local_b0._M_dataplus._M_p = (pointer)peVar8;
LAB_0063a064:
    std::__cxx11::string::_M_construct<char_const*>((string *)process,"open","");
    Transport::ProfilerStop(&this->super_Transport,process);
    peVar7 = (element_type *)(process->_M_dataplus)._M_p;
    if (peVar7 == peVar8) goto LAB_0063a084;
  }
  else {
    if (openMode == Read) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      std::fstream::open((string *)&this->m_FileStream,_Var6);
      peVar8 = (element_type *)&local_f0.field_2;
      process = &local_f0;
      local_f0._M_dataplus._M_p = (pointer)peVar8;
      goto LAB_0063a064;
    }
    if (openMode == Write) {
      if (async) {
        this->m_IsOpening = true;
        local_158._0_8_ = (element_type *)0x0;
        local_158._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
        p_Var3->_M_use_count = 1;
        p_Var3->_M_weak_count = 1;
        p_Var3->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00873998;
        local_168 = (element_type *)(p_Var3 + 1);
        p_Var3[1]._M_use_count = 0;
        p_Var3[1]._M_weak_count = 0;
        *(undefined4 *)&p_Var3[2]._vptr__Sp_counted_base = 0;
        *(undefined1 *)((long)&p_Var3[2]._vptr__Sp_counted_base + 4) = 0;
        p_Var3[2]._M_use_count = 0;
        p_Var3[3]._vptr__Sp_counted_base = (_func_int **)0x0;
        p_Var3[3]._M_use_count = 0;
        p_Var3[1]._vptr__Sp_counted_base = (_func_int **)&PTR___Async_state_impl_008739e8;
        this_00 = (_Result_base *)operator_new(0x10);
        *(undefined8 *)this_00 = 0;
        *(undefined8 *)(this_00 + 8) = 0;
        std::__future_base::_Result_base::_Result_base(this_00);
        *(undefined ***)this_00 = &PTR__M_destroy_00872b90;
        p_Var3[4]._vptr__Sp_counted_base = (_func_int **)this_00;
        *(_Atomic_word **)&p_Var3[4]._M_use_count = &p_Var3[5]._M_use_count;
        pcVar1 = (name->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&p_Var3[4]._M_use_count,pcVar1,pcVar1 + name->_M_string_length);
        peVar8 = local_168;
        *(FileFStream **)&p_Var3[6]._M_use_count = this;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_160 = (long *)operator_new(0x20);
        *local_160 = (long)&PTR___State_00873a40;
        local_160[1] = (long)peVar8;
        local_160[2] = (long)std::__future_base::
                             _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/transport/file/FileFStream.cpp:47:30),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_void>
                             ::_M_run;
        local_160[3] = 0;
        std::thread::_M_start_thread(&local_178,&local_160,0);
        if (local_160 != (long *)0x0) {
          (**(code **)(*local_160 + 8))();
        }
        if (p_Var3[3]._vptr__Sp_counted_base != (_func_int **)0x0) {
          std::terminate();
        }
        p_Var3[3]._vptr__Sp_counted_base =
             (_func_int **)
             local_178._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_158._0_8_ = peVar8;
        local_158._8_8_ = p_Var3;
        std::__basic_future<void>::__basic_future(&local_178,(__state_type *)local_158);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
        }
        _Var2._M_pi = local_178._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        peVar8 = local_178._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_178._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var3 = (this->m_OpenFuture).super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             peVar8;
        (this->m_OpenFuture).super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var2._M_pi;
        if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3),
           local_178._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        goto LAB_0063a084;
      }
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"open","");
      Transport::ProfilerStart(&this->super_Transport,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      std::fstream::open((string *)&this->m_FileStream,_Var6);
      peVar8 = (element_type *)&local_70.field_2;
      process = &local_70;
      local_70._M_dataplus._M_p = (pointer)peVar8;
      goto LAB_0063a064;
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "unknown open mode for file ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_158);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110.field_2._8_8_ = plVar4[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar5;
      local_110._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_110._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    CheckFile(this,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    peVar7 = (element_type *)local_158._0_8_;
    if ((element_type *)local_158._0_8_ == (element_type *)(local_158 + 0x10)) goto LAB_0063a084;
  }
  operator_delete(peVar7);
LAB_0063a084:
  if (this->m_IsOpening == false) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "couldn\'t open file ",__rhs);
    plVar4 = (long *)std::__cxx11::string::append((char *)local_158);
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_130.field_2._M_allocated_capacity = *psVar5;
      local_130.field_2._8_8_ = plVar4[3];
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar5;
      local_130._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_130._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    CheckFile(this,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((element_type *)local_158._0_8_ != (element_type *)(local_158 + 0x10)) {
      operator_delete((void *)local_158._0_8_);
    }
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FileFStream::Open(const std::string &name, const Mode openMode, const bool async,
                       const bool directio)
{
    auto lf_AsyncOpenWrite = [&](const std::string &name) -> void {
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
        ProfilerStop("open");
    };
    m_Name = name;
    CheckName();
    m_OpenMode = openMode;

    switch (m_OpenMode)
    {
    case Mode::Write:
        if (async)
        {
            m_IsOpening = true;
            m_OpenFuture = std::async(std::launch::async, lf_AsyncOpenWrite, name);
        }
        else
        {
            ProfilerStart("open");
            m_FileStream.open(name, std::fstream::out | std::fstream::binary | std::fstream::trunc);
            ProfilerStop("open");
        }
        break;

    case Mode::Append:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::out | std::fstream::binary);
        m_FileStream.seekp(0, std::ios_base::end);
        ProfilerStop("open");
        break;

    case Mode::Read:
        ProfilerStart("open");
        m_FileStream.open(name, std::fstream::in | std::fstream::binary);
        ProfilerStop("open");
        break;

    default:
        CheckFile("unknown open mode for file " + m_Name + ", in call to stream open");
    }

    if (!m_IsOpening)
    {
        CheckFile("couldn't open file " + m_Name +
                  ", check permissions or path existence, in call to fstream open");
        m_IsOpen = true;
    }
}